

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O1

void setseed(lua_State *L,unsigned_long *state,lua_Unsigned n1,lua_Unsigned n2)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  lua_Unsigned lVar5;
  lua_Unsigned lVar6;
  ulong uVar7;
  
  *state = n1;
  state[1] = 0xff;
  state[2] = n2;
  state[3] = 0;
  iVar2 = 0x10;
  uVar1 = 0;
  uVar3 = 0xff;
  lVar5 = n1;
  lVar6 = n2;
  do {
    uVar7 = lVar6 ^ lVar5;
    uVar1 = uVar1 ^ uVar3;
    lVar5 = lVar5 ^ uVar1;
    uVar4 = uVar7 ^ uVar3;
    lVar6 = uVar3 << 0x11 ^ uVar7;
    uVar1 = uVar1 << 0x2d | uVar1 >> 0x13;
    iVar2 = iVar2 + -1;
    uVar3 = uVar4;
  } while (iVar2 != 0);
  *state = lVar5;
  state[1] = uVar4;
  state[2] = lVar6;
  state[3] = uVar1;
  lua_pushinteger(L,n1);
  lua_pushinteger(L,n2);
  return;
}

Assistant:

static void setseed (lua_State *L, Rand64 *state,
                     lua_Unsigned n1, lua_Unsigned n2) {
  int i;
  state[0] = Int2I(n1);
  state[1] = Int2I(0xff);  /* avoid a zero state */
  state[2] = Int2I(n2);
  state[3] = Int2I(0);
  for (i = 0; i < 16; i++)
    nextrand(state);  /* discard initial values to "spread" seed */
  lua_pushinteger(L, l_castU2S(n1));
  lua_pushinteger(L, l_castU2S(n2));
}